

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  SUNMatrix I;
  SUNMatrix A;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  N_Vector p_Var12;
  N_Vector p_Var13;
  long lVar14;
  undefined8 *puVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  char *__s;
  long lVar20;
  long lVar21;
  long lVar22;
  double dVar23;
  SUNContext sunctx;
  long local_68;
  N_Vector local_60;
  SUNMatrix local_58;
  SUNMatrix local_50;
  long local_48;
  N_Vector local_40;
  long local_38;
  
  iVar2 = SUNContext_Create(0,&sunctx);
  if (iVar2 == 0) {
    if (argc < 5) {
      __s = 
      "ERROR: FOUR (4) Inputs required: matrix cols, matrux uband, matrix lband, print timing ";
    }
    else {
      lVar10 = atol(argv[1]);
      if (lVar10 < 1) {
        __s = "ERROR: number of matrix columns must be a positive integer ";
      }
      else {
        lVar11 = atol(argv[2]);
        if (lVar11 < 1 || lVar10 <= lVar11) {
          __s = 
          "ERROR: matrix upper bandwidth must be a positive integer, less than number of columns ";
        }
        else {
          local_68 = atol(argv[3]);
          if (0 < local_68 && local_68 < lVar10) {
            iVar2 = atoi(argv[4]);
            SetTiming(iVar2);
            lVar22 = 0;
            printf("\nBand matrix test: size %ld, bandwidths %ld %ld\n\n",lVar10,lVar11,local_68);
            local_50 = (SUNMatrix)SUNBandMatrix(lVar10,lVar11,local_68,sunctx);
            local_58 = (SUNMatrix)SUNBandMatrix(lVar10,0,0);
            p_Var12 = (N_Vector)N_VNew_Serial(lVar10,sunctx);
            p_Var13 = (N_Vector)N_VNew_Serial(lVar10);
            local_60 = p_Var12;
            local_48 = N_VGetArrayPointer(p_Var12);
            local_40 = p_Var13;
            lVar14 = N_VGetArrayPointer(p_Var13);
            lVar1 = lVar10 + -1;
            local_38 = lVar1 - local_68;
            while( true ) {
              A = local_50;
              lVar19 = lVar22;
              if (lVar11 < lVar22) {
                lVar19 = lVar11;
              }
              if (lVar22 == lVar10) break;
              lVar19 = lVar19 + lVar22;
              puVar15 = (undefined8 *)SUNBandMatrix_Column(local_58,lVar22);
              *puVar15 = 0x3ff0000000000000;
              lVar16 = SUNBandMatrix_Column(local_50);
              lVar17 = lVar11;
              if (lVar22 < lVar11) {
                lVar17 = lVar22;
              }
              lVar17 = -lVar17;
              lVar20 = lVar1 - lVar22;
              if (lVar22 <= local_38) {
                lVar20 = local_68;
              }
              for (; lVar17 <= lVar20; lVar17 = lVar17 + 1) {
                *(double *)(lVar16 + lVar17 * 8) = (double)lVar19;
                lVar19 = lVar19 + -1;
              }
              lVar22 = lVar22 + 1;
            }
            lVar22 = -local_68;
            lVar19 = 0;
            lVar17 = 0;
            while( true ) {
              lVar16 = 0;
              if (0 < lVar22) {
                lVar16 = lVar22;
              }
              if (lVar17 == lVar10) break;
              *(double *)(local_48 + lVar17 * 8) = (double)lVar17;
              *(undefined8 *)(lVar14 + lVar17 * 8) = 0;
              lVar16 = lVar19 + lVar16 * 2;
              lVar20 = lVar17 - local_68;
              if (lVar17 - local_68 < 1) {
                lVar20 = 0;
              }
              lVar21 = lVar17 + lVar11;
              if (lVar10 <= lVar17 + lVar11) {
                lVar21 = lVar1;
              }
              dVar23 = 0.0;
              for (; lVar20 <= lVar21; lVar20 = lVar20 + 1) {
                dVar23 = dVar23 + (double)(lVar16 * lVar20);
                *(double *)(lVar14 + lVar17 * 8) = dVar23;
                lVar16 = lVar16 + 2;
              }
              lVar17 = lVar17 + 1;
              lVar19 = lVar19 + -1;
              lVar22 = lVar22 + 1;
            }
            iVar2 = Test_SUNMatGetID(local_50,SUNMATRIX_BAND,0);
            iVar3 = Test_SUNMatClone(A,0);
            iVar4 = Test_SUNMatCopy(A,0);
            iVar5 = Test_SUNMatZero(A,0);
            I = local_58;
            iVar6 = Test_SUNMatScaleAdd(A,local_58,0);
            iVar7 = Test_SUNMatScaleAddI(A,I,0);
            p_Var12 = local_40;
            iVar8 = Test_SUNMatMatvec(A,local_60,local_40,0);
            iVar9 = Test_SUNMatSpace(A,0);
            uVar18 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2;
            if (uVar18 == 0) {
              puts("SUCCESS: SUNMatrix module passed all tests \n ");
              p_Var13 = local_60;
            }
            else {
              printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)uVar18);
              puts("\nA =");
              SUNBandMatrix_Print(A,_stdout);
              puts("\nI =");
              SUNBandMatrix_Print(I,_stdout);
              puts("\nx =");
              p_Var13 = local_60;
              N_VPrint_Serial(local_60);
              puts("\ny =");
              N_VPrint_Serial(p_Var12);
            }
            SUNMatDestroy(A);
            SUNMatDestroy(I);
            N_VDestroy(p_Var13);
            N_VDestroy(p_Var12);
            SUNContext_Free(&sunctx);
            return uVar18;
          }
          __s = 
          "ERROR: matrix lower bandwidth must be a positive integer, less than number of columns ";
        }
      }
    }
  }
  else {
    __s = "ERROR: SUNContext_Create failed";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                   /* counter for test failures  */
  sunindextype cols, uband, lband; /* matrix columns, bandwidths */
  SUNMatrix A, I;                  /* test matrices              */
  N_Vector x, y;                   /* test vectors               */
  int print_timing;
  sunindextype i, j, k, kstart, kend, jstart, jend;
  sunrealtype *colj, *xdata, *ydata;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set vector length */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required: matrix cols, matrux uband, matrix "
           "lband, print timing \n");
    return (-1);
  }

  cols = (sunindextype)atol(argv[1]);
  if (cols <= 0)
  {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return (-1);
  }

  uband = (sunindextype)atol(argv[2]);
  if ((uband <= 0) || (uband >= cols))
  {
    printf("ERROR: matrix upper bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  lband = (sunindextype)atol(argv[3]);
  if ((lband <= 0) || (lband >= cols))
  {
    printf("ERROR: matrix lower bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nBand matrix test: size %ld, bandwidths %ld %ld\n\n", (long int)cols,
         (long int)uband, (long int)lband);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;

  /* Create matrices and vectors */
  A = SUNBandMatrix(cols, uband, lband, sunctx);
  I = SUNBandMatrix(cols, 0, 0, sunctx);
  x = N_VNew_Serial(cols, sunctx);
  y = N_VNew_Serial(cols, sunctx);

  /* Fill matrices */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);
  for (j = 0; j < cols; j++)
  {
    /* identity matrix */
    colj    = SUNBandMatrix_Column(I, j);
    colj[0] = SUN_RCONST(1.0);

    /* A matrix */
    colj   = SUNBandMatrix_Column(A, j);
    kstart = (j < uband) ? -j : -uband;
    kend   = (j > cols - 1 - lband) ? cols - 1 - j : lband;
    for (k = kstart; k <= kend; k++)
    {
      colj[k] = j - k; /* A(i,j) = j + (j-i) */
    }
  }

  /* Fill vectors */
  for (i = 0; i < cols; i++)
  {
    /* x vector */
    xdata[i] = i;

    /* y vector */
    ydata[i] = SUN_RCONST(0.0);
    jstart   = SUNMAX(0, i - lband);
    jend     = SUNMIN(cols - 1, i + uband);
    for (j = jstart; j <= jend; j++) { ydata[i] += (j + j - i) * (j); }
  }

  /* Run Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_BAND, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  fails += Test_SUNMatScaleAdd(A, I, 0);
  fails += Test_SUNMatScaleAddI(A, I, 0);
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNBandMatrix_Print(A, stdout);
    printf("\nI =\n");
    SUNBandMatrix_Print(I, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  }
  else { printf("SUCCESS: SUNMatrix module passed all tests \n \n"); }

  /* Free matrices and vectors */
  SUNMatDestroy(A);
  SUNMatDestroy(I);
  N_VDestroy(x);
  N_VDestroy(y);
  SUNContext_Free(&sunctx);

  return (fails);
}